

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O1

bool icu_63::number::impl::GeneratorHelpers::symbols
               (MacroProps *macros,UnicodeString *sb,UErrorCode *status)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  NumberingSystem *this;
  char *__s1;
  UErrorCode *extraout_RDX;
  SymbolsWrapper *this_00;
  
  this_00 = &macros->symbols;
  bVar1 = SymbolsWrapper::isNumberingSystem(this_00);
  if (bVar1) {
    this = SymbolsWrapper::getNumberingSystem(this_00);
    __s1 = NumberingSystem::getName(this);
    iVar3 = strcmp(__s1,"latn");
    if (iVar3 == 0) {
      UnicodeString::doAppend(sb,L"latin",0,-1);
    }
    else {
      UnicodeString::doAppend(sb,L"numbering-system/",0,-1);
      blueprint_helpers::generateNumberingSystemOption(this,sb,extraout_RDX);
    }
  }
  else {
    bVar2 = SymbolsWrapper::isDecimalFormatSymbols(this_00);
    if (bVar2) {
      *status = U_UNSUPPORTED_ERROR;
    }
  }
  return bVar1;
}

Assistant:

bool GeneratorHelpers::symbols(const MacroProps& macros, UnicodeString& sb, UErrorCode& status) {
    if (macros.symbols.isNumberingSystem()) {
        const NumberingSystem& ns = *macros.symbols.getNumberingSystem();
        if (uprv_strcmp(ns.getName(), "latn") == 0) {
            sb.append(u"latin", -1);
        } else {
            sb.append(u"numbering-system/", -1);
            blueprint_helpers::generateNumberingSystemOption(ns, sb, status);
        }
        return true;
    } else if (macros.symbols.isDecimalFormatSymbols()) {
        status = U_UNSUPPORTED_ERROR;
        return false;
    } else {
        // No custom symbols
        return false;
    }
}